

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# package.cpp
# Opt level: O0

int32_t getTypeEnumForInputData(uint8_t *data,int32_t length,UErrorCode *pErrorCode)

{
  int32_t local_38;
  int32_t local_34;
  int32_t headerLength;
  int32_t infoLength;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  uint8_t *puStack_18;
  int32_t length_local;
  uint8_t *data_local;
  
  pInfo = (UDataInfo *)pErrorCode;
  pErrorCode_local._4_4_ = length;
  puStack_18 = data;
  _headerLength = getDataInfo(data,length,&local_34,&local_38,pErrorCode);
  if (_headerLength == (UDataInfo *)0x0) {
    data_local._4_4_ = -1;
  }
  else {
    data_local._4_4_ = makeTypeEnum(_headerLength->charsetFamily,_headerLength->isBigEndian);
  }
  return data_local._4_4_;
}

Assistant:

static int32_t
getTypeEnumForInputData(const uint8_t *data, int32_t length,
                        UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t infoLength, headerLength;

    /* getDataInfo() checks for illegal arguments */
    pInfo=getDataInfo(data, length, infoLength, headerLength, pErrorCode);
    if(pInfo==NULL) {
        return -1;
    }

    return makeTypeEnum(pInfo->charsetFamily, (UBool)pInfo->isBigEndian);
}